

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O1

void blake2b_write(BinarySink *bs,void *vp,size_t len)

{
  BinarySink **ppBVar1;
  uint8_t *blk;
  BinarySink *pBVar2;
  ulong __n;
  
  if (len != 0) {
    blk = (uint8_t *)((long)&bs[-7].writefmtv + 4);
    do {
      if (bs[-1].write == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x80) {
        f_outer((uint64_t *)&bs[-10].binarysink_,blk,(uint64_t)bs[-1].writefmtv,
                (uint64_t)bs[-1].binarysink_,0);
        bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
      }
      __n = 0x80 - (long)bs[-1].write;
      if (len <= __n) {
        __n = len;
      }
      memcpy(blk + (long)bs[-1].write,vp,__n);
      bs[-1].write = bs[-1].write + __n;
      vp = (void *)((long)vp + __n);
      ppBVar1 = &bs[-1].binarysink_;
      pBVar2 = *ppBVar1;
      *ppBVar1 = (BinarySink *)((long)&(*ppBVar1)->write + __n);
      bs[-1].writefmtv = bs[-1].writefmtv + CARRY8((ulong)pBVar2,__n);
      len = len - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

static void blake2b_write(BinarySink *bs, const void *vp, size_t len)
{
    blake2b *s = BinarySink_DOWNCAST(bs, blake2b);
    const uint8_t *p = vp;

    while (len > 0) {
        if (s->used == sizeof(s->block)) {
            f_outer(s->h, s->block, s->lenhi, s->lenlo, 0);
            s->used = 0;
        }

        size_t chunk = sizeof(s->block) - s->used;
        if (chunk > len)
            chunk = len;

        memcpy(s->block + s->used, p, chunk);
        s->used += chunk;
        p += chunk;
        len -= chunk;

        s->lenlo += chunk;
        s->lenhi += (s->lenlo < chunk);
    }
}